

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Class.cpp
# Opt level: O1

void __thiscall hdc::Class::addMethod(Class *this,Def *def)

{
  pointer *pppDVar1;
  iterator iVar2;
  int iVar3;
  Def *local_48;
  string local_40;
  
  iVar2._M_current =
       (this->methods).super__Vector_base<hdc::Def_*,_std::allocator<hdc::Def_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48 = def;
  if (iVar2._M_current ==
      (this->methods).super__Vector_base<hdc::Def_*,_std::allocator<hdc::Def_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<hdc::Def*,std::allocator<hdc::Def*>>::_M_realloc_insert<hdc::Def*const&>
              ((vector<hdc::Def*,std::allocator<hdc::Def*>> *)&this->methods,iVar2,&local_48);
  }
  else {
    *iVar2._M_current = def;
    pppDVar1 = &(this->methods).super__Vector_base<hdc::Def_*,_std::allocator<hdc::Def_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppDVar1 = *pppDVar1 + 1;
  }
  Def::setClass(local_48,this);
  Def::setFile(local_48,this->file);
  iVar3 = this->methodCounter;
  this->methodCounter = iVar3 + 1;
  Def::setId(local_48,iVar3);
  Def::getName_abi_cxx11_(&local_40,local_48);
  iVar3 = std::__cxx11::string::compare((char *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (iVar3 == 0) {
    iVar2._M_current =
         (this->constructors).super__Vector_base<hdc::Def_*,_std::allocator<hdc::Def_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->constructors).super__Vector_base<hdc::Def_*,_std::allocator<hdc::Def_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<hdc::Def*,std::allocator<hdc::Def*>>::_M_realloc_insert<hdc::Def*const&>
                ((vector<hdc::Def*,std::allocator<hdc::Def*>> *)&this->constructors,iVar2,&local_48)
      ;
    }
    else {
      *iVar2._M_current = local_48;
      pppDVar1 = &(this->constructors).super__Vector_base<hdc::Def_*,_std::allocator<hdc::Def_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppDVar1 = *pppDVar1 + 1;
    }
  }
  else {
    Def::getName_abi_cxx11_(&local_40,local_48);
    iVar3 = std::__cxx11::string::compare((char *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (iVar3 == 0) {
      this->destructor = local_48;
    }
  }
  return;
}

Assistant:

void Class::addMethod(Def* def) {
    methods.push_back(def);
    def->setClass(this);
    def->setFile(this->file);
    def->setId(methodCounter++);
    //def->setGlobalID(0);

    if (def->getName().compare("init") == 0) {
        constructors.push_back(def);
    } else if (def->getName().compare("destroy") == 0) {
        destructor = def;
    }
}